

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UILoader.cpp
# Opt level: O0

void UI::LoaderLoadingModal(shared_ptr<LoaderThread> *loader_thread)

{
  bool bVar1;
  float offset_from_start_x;
  float unaff_retaddr;
  ImGuiCol unaff_retaddr_00;
  ImGuiWindowFlags in_stack_0000001c;
  bool *in_stack_00000020;
  char *in_stack_00000028;
  ImU32 *in_stack_00000068;
  int in_stack_00000070;
  float in_stack_00000074;
  char *in_stack_00000078;
  char *in_stack_ffffffffffffffe8;
  float in_stack_fffffffffffffff0;
  
  ImGui::SetNextWindowCentering();
  bVar1 = ImGui::BeginPopupModal(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  if (bVar1) {
    offset_from_start_x = (float)ImGui::GetColorU32(unaff_retaddr_00,unaff_retaddr);
    ImGui::Spinner(in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
    ImGui::SameLine(offset_from_start_x,in_stack_fffffffffffffff0);
    std::__shared_ptr_access<LoaderThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<LoaderThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x188157);
    LoaderThread::GetNotification((LoaderThread *)0x18815f);
    ImGui::TextUnformatted
              ((char *)CONCAT44(offset_from_start_x,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void LoaderLoadingModal(const std::shared_ptr<LoaderThread> &loader_thread) {
	ImGui::SetNextWindowCentering();
	if (ImGui::BeginPopupModal(kLoaderLoadingModal, nullptr,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar |
	                               ImGuiWindowFlags_NoMove)) {
		ImGui::Spinner("##spinner", 12, 6, ImGui::GetColorU32(ImGuiCol_ButtonHovered));
		ImGui::SameLine();
		ImGui::TextUnformatted(loader_thread->GetNotification());

		ImGui::EndPopup();
	}
}